

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryInputGeometryShaderTests.cpp
# Opt level: O1

TestCaseGroup * vkt::geometry::createInputGeometryShaderTests(TestContext *testCtx)

{
  TestNode *this;
  TestNode *this_00;
  TestNode *this_01;
  TestNode *this_02;
  GeometryExpanderRenderTest *pGVar1;
  long *plVar2;
  long *plVar3;
  int iVar4;
  long lVar5;
  string name;
  PrimitiveTestSpec primitives;
  long *local_1e8;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  PrimitiveTestSpec local_1a8 [4];
  ios_base local_138 [264];
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"input","Different input primitives.");
  this_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_00,testCtx,"basic_primitive","Basic Primitive geometry tests");
  this_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_01,testCtx,"triangle_strip_adjacency",
             "Different triangle_strip_adjacency vertex counts.");
  this_02 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_02,testCtx,"conversion","Different input and output primitives.")
  ;
  lVar5 = 0;
  do {
    pGVar1 = (GeometryExpanderRenderTest *)operator_new(0x78);
    anon_unknown_2::GeometryExpanderRenderTest::GeometryExpanderRenderTest
              (pGVar1,testCtx,(PrimitiveTestSpec *)(&DAT_00d48f50 + lVar5));
    tcu::TestNode::addChild(this_00,(TestNode *)pGVar1);
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0xd8);
  iVar4 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,iVar4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0xb6fbcd);
    local_1e8 = &local_1d8;
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_1d8 = *plVar3;
      lStack_1d0 = plVar2[3];
    }
    else {
      local_1d8 = *plVar3;
      local_1e8 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    local_1a8[0].primitiveType = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY;
    local_1a8[0].name = (char *)local_1e8;
    local_1a8[0].outputType = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
    pGVar1 = (GeometryExpanderRenderTest *)operator_new(0x80);
    anon_unknown_2::GeometryExpanderRenderTest::GeometryExpanderRenderTest(pGVar1,testCtx,local_1a8)
    ;
    (pGVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_00d49188;
    *(int *)&pGVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar4;
    tcu::TestNode::addChild(this_01,(TestNode *)pGVar1);
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0xd);
  lVar5 = 0;
  do {
    pGVar1 = (GeometryExpanderRenderTest *)operator_new(0x78);
    anon_unknown_2::GeometryExpanderRenderTest::GeometryExpanderRenderTest
              (pGVar1,testCtx,
               (PrimitiveTestSpec *)
               ((long)&createInputGeometryShaderTests::conversionPrimitives[0].primitiveType + lVar5
               ));
    tcu::TestNode::addChild(this_02,(TestNode *)pGVar1);
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x90);
  tcu::TestNode::addChild(this,this_00);
  tcu::TestNode::addChild(this,this_01);
  tcu::TestNode::addChild(this,this_02);
  return (TestCaseGroup *)this;
}

Assistant:

TestCaseGroup* createInputGeometryShaderTests (TestContext& testCtx)
{
	MovePtr<TestCaseGroup> inputPrimitiveGroup		(new TestCaseGroup(testCtx, "input", "Different input primitives."));
	MovePtr<TestCaseGroup> basicPrimitiveGroup		(new TestCaseGroup(testCtx, "basic_primitive", "Basic Primitive geometry tests"));
	MovePtr<TestCaseGroup> triStripAdjacencyGroup	(new TestCaseGroup(testCtx, "triangle_strip_adjacency",	"Different triangle_strip_adjacency vertex counts."));
	MovePtr<TestCaseGroup> conversionPrimitiveGroup	(new TestCaseGroup(testCtx, "conversion", "Different input and output primitives."));

	const PrimitiveTestSpec inputPrimitives[] =
	{
		{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,						"points",					VK_PRIMITIVE_TOPOLOGY_POINT_LIST		},
		{ VK_PRIMITIVE_TOPOLOGY_LINE_LIST,						"lines",					VK_PRIMITIVE_TOPOLOGY_LINE_STRIP		},
		{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,						"line_strip",				VK_PRIMITIVE_TOPOLOGY_LINE_STRIP		},
		{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,					"triangles",				VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP	},
		{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,					"triangle_strip",			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP	},
		{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,					"triangle_fan",				VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP	},
		{ VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY,		"lines_adjacency",			VK_PRIMITIVE_TOPOLOGY_LINE_STRIP		},
		{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY,		"line_strip_adjacency",		VK_PRIMITIVE_TOPOLOGY_LINE_STRIP		},
		{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY,	"triangles_adjacency",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP	}
	};

		// more basic types
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(inputPrimitives); ++ndx)
			basicPrimitiveGroup->addChild(new GeometryExpanderRenderTest(testCtx, inputPrimitives[ndx]));

		// triangle strip adjacency with different vertex counts
		for (int vertexCount = 0; vertexCount <= 12; ++vertexCount)
		{
			const string name = "vertex_count_" + de::toString(vertexCount);
			const PrimitiveTestSpec primitives = { VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY, name.c_str(), VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP };

			triStripAdjacencyGroup->addChild(new TriangleStripAdjacencyVertexCountTest(testCtx, primitives, vertexCount));
		}

		// different type conversions
		{
			static const PrimitiveTestSpec conversionPrimitives[] =
			{
				{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	"triangles_to_points",	VK_PRIMITIVE_TOPOLOGY_POINT_LIST	},
				{ VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		"lines_to_points",		VK_PRIMITIVE_TOPOLOGY_POINT_LIST	},
				{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		"points_to_lines",		VK_PRIMITIVE_TOPOLOGY_LINE_STRIP	},
				{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	"triangles_to_lines",	VK_PRIMITIVE_TOPOLOGY_LINE_STRIP	},
				{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		"points_to_triangles",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP},
				{ VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		"lines_to_triangles",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP}
			};

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(conversionPrimitives); ++ndx)
				conversionPrimitiveGroup->addChild(new GeometryExpanderRenderTest(testCtx, conversionPrimitives[ndx]));
		}

	inputPrimitiveGroup->addChild(basicPrimitiveGroup.release());
	inputPrimitiveGroup->addChild(triStripAdjacencyGroup.release());
	inputPrimitiveGroup->addChild(conversionPrimitiveGroup.release());
	return inputPrimitiveGroup.release();
}